

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictive_info.c
# Opt level: O0

double inform_predictive_info
                 (int *series,size_t n,size_t m,int b,size_t kpast,size_t kfuture,inform_error *err)

{
  _Bool _Var1;
  size_t sVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  long lVar5;
  void *__ptr;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double pi;
  inform_dist futures;
  inform_dist histories;
  inform_dist states;
  uint32_t *data;
  size_t total_size;
  size_t states_size;
  size_t futures_size;
  size_t histories_size;
  size_t N;
  size_t kfuture_local;
  size_t kpast_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,kpast,kfuture,err);
  if (_Var1) {
    series_local = (int *)0x7ff8000000000000;
  }
  else {
    sVar2 = n * (((m - kpast) - kfuture) + 1);
    auVar7._8_4_ = (int)(kpast >> 0x20);
    auVar7._0_8_ = kpast;
    auVar7._12_4_ = 0x45300000;
    dVar6 = pow((double)b,
                (auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)kpast) - 4503599627370496.0));
    puVar3 = (uint32_t *)((long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f)
    ;
    auVar8._8_4_ = (int)(kfuture >> 0x20);
    auVar8._0_8_ = kfuture;
    auVar8._12_4_ = 0x45300000;
    dVar6 = pow((double)b,
                (auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)kfuture) - 4503599627370496.0));
    puVar4 = (uint32_t *)((long)dVar6 | (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f)
    ;
    lVar5 = (long)puVar3 * (long)puVar4;
    __ptr = calloc((long)(lVar5 + (long)puVar3) + (long)puVar4,4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x7ff8000000000000;
    }
    else {
      futures.counts = (long)__ptr + lVar5 * 4;
      pi = (double)((long)__ptr + (long)puVar3 * 4 + lVar5 * 4);
      futures.histogram = puVar4;
      futures.size = sVar2;
      histories.histogram = puVar3;
      histories.size = sVar2;
      histories.counts = (uint64_t)__ptr;
      accumulate_observations
                (series,n,m,b,kpast,kfuture,(inform_dist *)&histories.counts,
                 (inform_dist *)&futures.counts,(inform_dist *)&pi);
      series_local = (int *)inform_shannon_mi((inform_dist *)&histories.counts,
                                              (inform_dist *)&futures.counts,(inform_dist *)&pi,2.0)
      ;
      free(__ptr);
    }
  }
  return (double)series_local;
}

Assistant:

double inform_predictive_info(int const *series, size_t n, size_t m, int b,
    size_t kpast, size_t kfuture, inform_error *err)
{
    if (check_arguments(series, n, m, b, kpast, kfuture, err)) return NAN;

    size_t const N = n * (m - kpast - kfuture + 1);

    size_t const histories_size = (size_t) pow((double) b, (double) kpast);
    size_t const futures_size = (size_t) pow((double) b, (double) kfuture);
    size_t const states_size = histories_size * futures_size;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };
    inform_dist futures   = { data + states_size + histories_size, futures_size, N };

    accumulate_observations(series, n, m, b, kpast, kfuture, &states,
        &histories, &futures);

    double pi = inform_shannon_mi(&states, &histories, &futures, 2.0);

    free(data);

    return pi;
}